

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
map_function::evaluate
          (map_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  bool bVar1;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *this_00
  ;
  unsigned_long *puVar2;
  string *s;
  const_reference pvVar3;
  reference pbVar4;
  expression_type *peVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_01;
  reference pbVar6;
  error_code *in_RCX;
  undefined8 in_RDX;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RDI
  ;
  optional<unsigned_long> oVar7;
  const_array_range_type cVar8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *item;
  iterator __end0;
  iterator __begin0;
  const_array_range_type *__range4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *result;
  reference arg0;
  expression_type *expr;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff18;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff20;
  assertion_error *this_02;
  jmespath_errc __e;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  json_array_arg_t *in_stack_ffffffffffffff48;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *this_03;
  assertion_error local_59 [2];
  _Storage<unsigned_long,_true> local_38;
  undefined1 local_30;
  error_code *local_28;
  undefined8 local_20;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  this_00 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::size(in_RSI);
  oVar7 = function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::arity(in_RDI);
  local_38._M_value =
       oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_30 = oVar7.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x4d85ac);
  if (this_00 !=
      (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
      *puVar2) {
    s = (string *)__cxa_allocate_exception(0x10);
    this_02 = local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff60._M_current,(char *)in_stack_ffffffffffffff58._M_current,
               (allocator<char> *)in_stack_ffffffffffffff50);
    assertion_error::assertion_error(this_02,s);
    __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  pvVar3 = std::
           vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::operator[](local_18,0);
  bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
          is_expression(pvVar3);
  __e = (jmespath_errc)((ulong)in_RDI >> 0x20);
  if (bVar1) {
    pvVar3 = std::
             vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator[](local_18,1);
    bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
            is_value(pvVar3);
    __e = (jmespath_errc)((ulong)in_RDI >> 0x20);
    if (bVar1) {
      pvVar3 = std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::operator[](local_18,0);
      peVar5 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               ::expression(pvVar3);
      pvVar3 = std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::operator[](local_18,1);
      parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
                (pvVar3);
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                        (in_stack_ffffffffffffff38);
      if (!bVar1) {
        std::error_code::operator=((error_code *)this_00,(jmespath_errc)((ulong)in_RDI >> 0x20));
        pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::null_value(this_00);
        return pbVar4;
      }
      this_01 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                ::create_json<jsoncons::json_array_arg_t_const&>
                          (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      cVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                        (in_stack_ffffffffffffff70);
      this_03 = (range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                 *)&stack0xffffffffffffff60;
      range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
      ::begin(this_03);
      range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
      ::end(this_03);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        if (!bVar1) {
          return this_01;
        }
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                              *)&stack0xffffffffffffff58);
        (*peVar5->_vptr_expr_base[2])(peVar5,pbVar6,local_20,local_28);
        bVar1 = std::error_code::operator_cast_to_bool(local_28);
        if (bVar1) break;
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                  (this_01,(json_const_pointer_arg_t *)this_03,
                   (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                   cVar8.last_._M_current._M_current);
        __gnu_cxx::
        __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)&stack0xffffffffffffff58);
      }
      std::error_code::operator=((error_code *)this_00,(jmespath_errc)((ulong)in_RDI >> 0x20));
      pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               ::null_value(this_00);
      return pbVar4;
    }
  }
  std::error_code::operator=((error_code *)this_00,__e);
  pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(this_00);
  return pbVar4;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!(args[0].is_expression() && args[1].is_value()))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                const auto& expr = args[0].expression();

                reference arg0 = args[1].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);

                for (auto& item : arg0.array_range())
                {
                    auto& j = expr.evaluate(item, context, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    result->emplace_back(json_const_pointer_arg, std::addressof(j));
                }

                return *result;
            }